

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O1

int cmsysProcess_WaitForExit(cmsysProcess *cp,double *userTimeout)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  kwsysProcessResults *pkVar4;
  int iVar5;
  undefined8 uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  
  if (cp == (cmsysProcess *)0x0) {
    return 1;
  }
  if (cp->State != 3) {
    return 1;
  }
  while (iVar5 = cmsysProcess_WaitForData(cp,(char **)0x0,(int *)0x0,userTimeout), 0 < iVar5) {
    if (iVar5 == 0xff) {
      return 0;
    }
  }
  if (cp->State != 1) {
    if (cp->SelectError != 0) {
      kwsysProcessCleanup(cp,0);
      cp->State = 1;
      return 1;
    }
    iVar5 = 6;
    if ((cp->Killed == 0) && (iVar5 = 5, cp->TimeoutExpired == 0)) {
      if (0 < cp->NumberOfCommands) {
        lVar9 = 0x10;
        lVar8 = 0;
        do {
          pkVar4 = cp->ProcessResults;
          uVar3 = cp->CommandExitCodes[lVar8];
          *(uint *)(pkVar4->ExitExceptionString + lVar9 + -0x18) = uVar3;
          uVar7 = uVar3 & 0x7f;
          if (uVar7 == 0) {
            pcVar1 = pkVar4->ExitExceptionString + lVar9 + -0x20;
            pcVar1[0] = '\x04';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            pcVar1[4] = '\0';
            pcVar1[5] = '\0';
            pcVar1[6] = '\0';
            pcVar1[7] = '\0';
            *(uint *)(pkVar4->ExitExceptionString + lVar9 + -0x14) = uVar3 >> 8 & 0xff;
            goto LAB_0039ade8;
          }
          if ((int)(uVar7 * 0x1000000 + 0x1000000) < 0x2000000) {
            builtin_strncpy(pkVar4->ExitExceptionString + lVar9 + -0x10,
                            "Error getting child return code.",0x21);
            pcVar1 = cp->ProcessResults->ExitExceptionString + lVar9 + -0x20;
            pcVar1[0] = '\x01';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            goto LAB_0039ade8;
          }
          pcVar1 = pkVar4->ExitExceptionString + lVar9 + -0x10;
          pcVar2 = pkVar4->ExitExceptionString + lVar9 + -0x20;
          pcVar2[0] = '\x02';
          pcVar2[1] = '\0';
          pcVar2[2] = '\0';
          pcVar2[3] = '\0';
          switch(uVar7) {
          case 1:
            pcVar2 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar2[0] = '\x05';
            pcVar2[1] = '\0';
            pcVar2[2] = '\0';
            pcVar2[3] = '\0';
            pcVar1[3] = 'H';
            pcVar1[4] = 'U';
            pcVar1[5] = 'P';
            pcVar1[6] = '\0';
            pcVar1[0] = 'S';
            pcVar1[1] = 'I';
            pcVar1[2] = 'G';
            pcVar1[3] = 'H';
            goto LAB_0039ade8;
          case 2:
            pcVar2 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar2[0] = '\x03';
            pcVar2[1] = '\0';
            pcVar2[2] = '\0';
            pcVar2[3] = '\0';
            pcVar1[7] = 't';
            pcVar1[8] = 'e';
            pcVar1[9] = 'r';
            pcVar1[10] = 'r';
            pcVar1[0xb] = 'u';
            pcVar1[0xc] = 'p';
            pcVar1[0xd] = 't';
            pcVar1[0xe] = '\0';
            uVar6 = 0x746e692072657355;
            goto LAB_0039ad3f;
          case 3:
            pcVar1 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar1[0] = '\x05';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            uVar6 = 0x54495551474953;
            break;
          case 4:
            pcVar2 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar2[0] = '\x02';
            pcVar2[1] = '\0';
            pcVar2[2] = '\0';
            pcVar2[3] = '\0';
            pcVar1[0] = 'I';
            pcVar1[1] = 'l';
            pcVar1[2] = 'l';
            pcVar1[3] = 'e';
            pcVar1[4] = 'g';
            pcVar1[5] = 'a';
            pcVar1[6] = 'l';
            pcVar1[7] = ' ';
            pcVar1[8] = 'i';
            pcVar1[9] = 'n';
            pcVar1[10] = 's';
            pcVar1[0xb] = 't';
            pcVar1[0xc] = 'r';
            pcVar1[0xd] = 'u';
            pcVar1[0xe] = 'c';
            pcVar1[0xf] = 't';
            pcVar1[0x10] = 'i';
            pcVar1[0x11] = 'o';
            pcVar1[0x12] = 'n';
            pcVar1[0x13] = '\0';
            goto LAB_0039ade8;
          case 5:
            pcVar1 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar1[0] = '\x05';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            uVar6 = 0x50415254474953;
            break;
          case 6:
            pcVar2 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar2[0] = '\x05';
            pcVar2[1] = '\0';
            pcVar2[2] = '\0';
            pcVar2[3] = '\0';
            pcVar1[6] = 'a';
            pcVar1[7] = 'b';
            pcVar1[8] = 'o';
            pcVar1[9] = 'r';
            pcVar1[10] = 't';
            pcVar1[0xb] = 'e';
            pcVar1[0xc] = 'd';
            pcVar1[0xd] = '\0';
            uVar6 = 0x626120646c696843;
            goto LAB_0039ad3f;
          case 7:
            pcVar2 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar2[0] = '\x01';
            pcVar2[1] = '\0';
            pcVar2[2] = '\0';
            pcVar2[3] = '\0';
            pcVar1[0] = 'B';
            pcVar1[1] = 'u';
            pcVar1[2] = 's';
            pcVar1[3] = ' ';
            pcVar1[4] = 'e';
            pcVar1[5] = 'r';
            pcVar1[6] = 'r';
            pcVar1[7] = 'o';
            pcVar1[8] = 'r';
            pcVar1[9] = '\0';
            goto LAB_0039ade8;
          case 8:
            pcVar2 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar2[0] = '\x04';
            pcVar2[1] = '\0';
            pcVar2[2] = '\0';
            pcVar2[3] = '\0';
            pcVar1[9] = 'p';
            pcVar1[10] = 'o';
            pcVar1[0xb] = 'i';
            pcVar1[0xc] = 'n';
            pcVar1[0xd] = 't';
            pcVar1[0xe] = ' ';
            pcVar1[0xf] = 'e';
            pcVar1[0x10] = 'x';
            pcVar1[0x11] = 'c';
            pcVar1[0x12] = 'e';
            pcVar1[0x13] = 'p';
            pcVar1[0x14] = 't';
            pcVar1[0x15] = 'i';
            pcVar1[0x16] = 'o';
            pcVar1[0x17] = 'n';
            pcVar1[0x18] = '\0';
            pcVar1[0] = 'F';
            pcVar1[1] = 'l';
            pcVar1[2] = 'o';
            pcVar1[3] = 'a';
            pcVar1[4] = 't';
            pcVar1[5] = 'i';
            pcVar1[6] = 'n';
            pcVar1[7] = 'g';
            pcVar1[8] = '-';
            pcVar1[9] = 'p';
            pcVar1[10] = 'o';
            pcVar1[0xb] = 'i';
            pcVar1[0xc] = 'n';
            pcVar1[0xd] = 't';
            pcVar1[0xe] = ' ';
            pcVar1[0xf] = 'e';
            goto LAB_0039ade8;
          case 9:
            pcVar2 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar2[0] = '\x05';
            pcVar2[1] = '\0';
            pcVar2[2] = '\0';
            pcVar2[3] = '\0';
            pcVar1[5] = ' ';
            pcVar1[6] = 'k';
            pcVar1[7] = 'i';
            pcVar1[8] = 'l';
            pcVar1[9] = 'l';
            pcVar1[10] = 'e';
            pcVar1[0xb] = 'd';
            pcVar1[0xc] = '\0';
            uVar6 = 0x696b20646c696843;
LAB_0039ad3f:
            *(undefined8 *)pcVar1 = uVar6;
            goto LAB_0039ade8;
          case 10:
            pcVar1 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar1[0] = '\x05';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            uVar6 = 0x31525355474953;
            break;
          case 0xb:
            pcVar2 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar2[0] = '\x01';
            pcVar2[1] = '\0';
            pcVar2[2] = '\0';
            pcVar2[3] = '\0';
            pcVar1[0] = 'S';
            pcVar1[1] = 'e';
            pcVar1[2] = 'g';
            pcVar1[3] = 'm';
            pcVar1[4] = 'e';
            pcVar1[5] = 'n';
            pcVar1[6] = 't';
            pcVar1[7] = 'a';
            pcVar1[8] = 't';
            pcVar1[9] = 'i';
            pcVar1[10] = 'o';
            pcVar1[0xb] = 'n';
            pcVar1[0xc] = ' ';
            pcVar1[0xd] = 'f';
            pcVar1[0xe] = 'a';
            pcVar1[0xf] = 'u';
            pcVar1[0xf] = 'u';
            pcVar1[0x10] = 'l';
            pcVar1[0x11] = 't';
            pcVar1[0x12] = '\0';
            goto LAB_0039ade8;
          case 0xc:
            pcVar1 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar1[0] = '\x05';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            uVar6 = 0x32525355474953;
            break;
          case 0xd:
            pcVar1 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar1[0] = '\x05';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            uVar6 = 0x45504950474953;
            break;
          case 0xe:
            pcVar1 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar1[0] = '\x05';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            uVar6 = 0x4d524c41474953;
            break;
          case 0xf:
            pcVar2 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar2[0] = '\x05';
            pcVar2[1] = '\0';
            pcVar2[2] = '\0';
            pcVar2[3] = '\0';
            pcVar1[0] = 'C';
            pcVar1[1] = 'h';
            pcVar1[2] = 'i';
            pcVar1[3] = 'l';
            pcVar1[4] = 'd';
            pcVar1[5] = ' ';
            pcVar1[6] = 't';
            pcVar1[7] = 'e';
            pcVar1[8] = 'r';
            pcVar1[9] = 'm';
            pcVar1[10] = 'i';
            pcVar1[0xb] = 'n';
            pcVar1[0xc] = 'a';
            pcVar1[0xd] = 't';
            pcVar1[0xe] = 'e';
            pcVar1[0xf] = 'd';
            pcVar1[0x10] = '\0';
            goto LAB_0039ade8;
          case 0x10:
            pcVar2 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar2[0] = '\x05';
            pcVar2[1] = '\0';
            pcVar2[2] = '\0';
            pcVar2[3] = '\0';
            pcVar1[0] = 'S';
            pcVar1[1] = 'I';
            pcVar1[2] = 'G';
            pcVar1[3] = 'S';
            pcVar1[4] = 'T';
            pcVar1[5] = 'K';
            pcVar1[6] = 'F';
            pcVar1[7] = 'L';
            pcVar1[8] = 'T';
            pcVar1[9] = '\0';
            goto LAB_0039ade8;
          case 0x11:
            pcVar1 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar1[0] = '\x05';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            uVar6 = 0x444c4843474953;
            break;
          case 0x12:
            pcVar1 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar1[0] = '\x05';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            uVar6 = 0x544e4f43474953;
            break;
          case 0x13:
            pcVar1 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar1[0] = '\x05';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            uVar6 = 0x504f5453474953;
            break;
          case 0x14:
            pcVar1 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar1[0] = '\x05';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            uVar6 = 0x50545354474953;
            break;
          case 0x15:
            pcVar1 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar1[0] = '\x05';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            uVar6 = 0x4e495454474953;
            break;
          case 0x16:
            pcVar1 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar1[0] = '\x05';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            uVar6 = 0x554f5454474953;
            break;
          case 0x17:
            pcVar2 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar2[0] = '\x05';
            pcVar2[1] = '\0';
            pcVar2[2] = '\0';
            pcVar2[3] = '\0';
            pcVar1[3] = 'U';
            pcVar1[4] = 'R';
            pcVar1[5] = 'G';
            pcVar1[6] = '\0';
            pcVar1[0] = 'S';
            pcVar1[1] = 'I';
            pcVar1[2] = 'G';
            pcVar1[3] = 'U';
            goto LAB_0039ade8;
          case 0x18:
            pcVar1 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar1[0] = '\x05';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            uVar6 = 0x55504358474953;
            break;
          case 0x19:
            pcVar1 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar1[0] = '\x05';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            uVar6 = 0x5a534658474953;
            break;
          case 0x1a:
            pcVar2 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar2[0] = '\x05';
            pcVar2[1] = '\0';
            pcVar2[2] = '\0';
            pcVar2[3] = '\0';
            pcVar1[0] = 'S';
            pcVar1[1] = 'I';
            pcVar1[2] = 'G';
            pcVar1[3] = 'V';
            pcVar1[4] = 'T';
            pcVar1[5] = 'A';
            pcVar1[6] = 'L';
            pcVar1[7] = 'R';
            pcVar1[8] = 'M';
            pcVar1[9] = '\0';
            goto LAB_0039ade8;
          case 0x1b:
            pcVar1 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar1[0] = '\x05';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            uVar6 = 0x464f5250474953;
            break;
          case 0x1c:
            pcVar2 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar2[0] = '\x05';
            pcVar2[1] = '\0';
            pcVar2[2] = '\0';
            pcVar2[3] = '\0';
            pcVar1[0] = 'S';
            pcVar1[1] = 'I';
            pcVar1[2] = 'G';
            pcVar1[3] = 'W';
            pcVar1[4] = 'I';
            pcVar1[5] = 'N';
            pcVar1[6] = 'C';
            pcVar1[7] = 'H';
            pcVar1[8] = '\0';
            goto LAB_0039ade8;
          case 0x1d:
            pcVar1 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar1[0] = '\x05';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            uVar6 = 0x4c4c4f50474953;
            break;
          case 0x1e:
            pcVar2 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar2[0] = '\x05';
            pcVar2[1] = '\0';
            pcVar2[2] = '\0';
            pcVar2[3] = '\0';
            pcVar1[3] = 'P';
            pcVar1[4] = 'W';
            pcVar1[5] = 'R';
            pcVar1[6] = '\0';
            pcVar1[0] = 'S';
            pcVar1[1] = 'I';
            pcVar1[2] = 'G';
            pcVar1[3] = 'P';
            goto LAB_0039ade8;
          case 0x1f:
            pcVar2 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar2[0] = '\x05';
            pcVar2[1] = '\0';
            pcVar2[2] = '\0';
            pcVar2[3] = '\0';
            pcVar1[3] = 'S';
            pcVar1[4] = 'Y';
            pcVar1[5] = 'S';
            pcVar1[6] = '\0';
            pcVar1[0] = 'S';
            pcVar1[1] = 'I';
            pcVar1[2] = 'G';
            pcVar1[3] = 'S';
            goto LAB_0039ade8;
          default:
            pcVar2 = pkVar4->ExitExceptionString + lVar9 + -0x1c;
            pcVar2[0] = '\x05';
            pcVar2[1] = '\0';
            pcVar2[2] = '\0';
            pcVar2[3] = '\0';
            sprintf(pcVar1,"Signal %d");
            goto LAB_0039ade8;
          }
          *(undefined8 *)(pkVar4->ExitExceptionString + lVar9 + -0x10) = uVar6;
LAB_0039ade8:
          lVar8 = lVar8 + 1;
          lVar9 = lVar9 + 0x414;
        } while (lVar8 < cp->NumberOfCommands);
      }
      iVar5 = cp->ProcessResults[(long)cp->NumberOfCommands + -1].State;
    }
    cp->State = iVar5;
  }
  kwsysProcessCleanup(cp,0);
  return 1;
}

Assistant:

int kwsysProcess_WaitForExit(kwsysProcess* cp, double* userTimeout)
{
  int prPipe = 0;

  /* Make sure we are executing a process.  */
  if (!cp || cp->State != kwsysProcess_State_Executing) {
    return 1;
  }

  /* Wait for all the pipes to close.  Ignore all data.  */
  while ((prPipe = kwsysProcess_WaitForData(cp, 0, 0, userTimeout)) > 0) {
    if (prPipe == kwsysProcess_Pipe_Timeout) {
      return 0;
    }
  }

  /* Check if there was an error in one of the waitpid calls.  */
  if (cp->State == kwsysProcess_State_Error) {
    /* The error message is already in its buffer.  Tell
       kwsysProcessCleanup to not create it.  */
    kwsysProcessCleanup(cp, 0);
    return 1;
  }

  /* Check whether the child reported an error invoking the process.  */
  if (cp->SelectError) {
    /* The error message is already in its buffer.  Tell
       kwsysProcessCleanup to not create it.  */
    kwsysProcessCleanup(cp, 0);
    cp->State = kwsysProcess_State_Error;
    return 1;
  }
  /* Determine the outcome.  */
  if (cp->Killed) {
    /* We killed the child.  */
    cp->State = kwsysProcess_State_Killed;
  } else if (cp->TimeoutExpired) {
    /* The timeout expired.  */
    cp->State = kwsysProcess_State_Expired;
  } else {
    /* The children exited.  Report the outcome of the child processes.  */
    for (prPipe = 0; prPipe < cp->NumberOfCommands; ++prPipe) {
      cp->ProcessResults[prPipe].ExitCode = cp->CommandExitCodes[prPipe];
      if (WIFEXITED(cp->ProcessResults[prPipe].ExitCode)) {
        /* The child exited normally.  */
        cp->ProcessResults[prPipe].State = kwsysProcess_StateByIndex_Exited;
        cp->ProcessResults[prPipe].ExitException = kwsysProcess_Exception_None;
        cp->ProcessResults[prPipe].ExitValue =
          (int)WEXITSTATUS(cp->ProcessResults[prPipe].ExitCode);
      } else if (WIFSIGNALED(cp->ProcessResults[prPipe].ExitCode)) {
        /* The child received an unhandled signal.  */
        cp->ProcessResults[prPipe].State = kwsysProcess_State_Exception;
        kwsysProcessSetExitExceptionByIndex(
          cp, (int)WTERMSIG(cp->ProcessResults[prPipe].ExitCode), prPipe);
      } else {
        /* Error getting the child return code.  */
        strcpy(cp->ProcessResults[prPipe].ExitExceptionString,
               "Error getting child return code.");
        cp->ProcessResults[prPipe].State = kwsysProcess_StateByIndex_Error;
      }
    }
    /* support legacy state status value */
    cp->State = cp->ProcessResults[cp->NumberOfCommands - 1].State;
  }
  /* Normal cleanup.  */
  kwsysProcessCleanup(cp, 0);
  return 1;
}